

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O1

void RigidBodyDynamics::ComputeConstraintImpulsesDirect
               (Model *model,VectorNd *Q,VectorNd *QDotMinus,ConstraintSet *CS,VectorNd *QDotPlus)

{
  ConstraintSet *H;
  uint uVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  VectorNd *lambda;
  void *local_50 [2];
  ConstraintSet *local_40;
  VectorNd *local_38;
  
  UpdateKinematicsCustom(model,Q,(VectorNd *)0x0,(VectorNd *)0x0);
  H = CS + 0x160;
  CompositeRigidBodyAlgorithm(model,Q,(MatrixNd *)H,false);
  lambda = (VectorNd *)0x0;
  CalcConstraintsJacobian(model,Q,CS,(MatrixNd *)(CS + 0x198),false);
  local_40 = H;
  local_38 = QDotMinus;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_50,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)&local_40);
  SolveConstrainedSystemDirect
            ((MatrixNd *)H,(MatrixNd *)(CS + 0x198),(VectorNd *)local_50,(VectorNd *)(CS + 0x150),
             lambda,(MatrixNd *)(CS + 0x1b0),(VectorNd *)(CS + 0x1c8),(VectorNd *)(CS + 0x1d8),
             (LinearSolver *)CS);
  free(local_50[0]);
  uVar1 = model->dof_count;
  if ((ulong)uVar1 != 0) {
    lVar2 = *(long *)(CS + 0x1d8);
    pdVar3 = (QDotPlus->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar7 = 0;
    do {
      pdVar3[uVar7] = *(double *)(lVar2 + uVar7 * 8);
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
  lVar2 = *(long *)(CS + 0x10);
  lVar4 = *(long *)(CS + 8);
  if (lVar2 - lVar4 != 0) {
    lVar5 = *(long *)(CS + 0x140);
    lVar6 = *(long *)(CS + 0x1d8);
    uVar7 = 0;
    do {
      *(undefined8 *)(lVar5 + uVar7 * 8) = *(undefined8 *)(lVar6 + (ulong)(uVar1 + (int)uVar7) * 8);
      uVar7 = uVar7 + 1;
    } while ((uVar7 & 0xffffffff) < (ulong)(lVar2 - lVar4 >> 2));
  }
  return;
}

Assistant:

RBDL_DLLAPI
void ComputeConstraintImpulsesDirect (
  Model &model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDotMinus,
  ConstraintSet &CS,
  Math::VectorNd &QDotPlus
)
{

  // Compute H
  UpdateKinematicsCustom (model, &Q, NULL, NULL);
  CompositeRigidBodyAlgorithm (model, Q, CS.H, false);

  // Compute G
  CalcConstraintsJacobian (model, Q, CS, CS.G, false);

  SolveConstrainedSystemDirect (CS.H, CS.G, CS.H * QDotMinus, CS.v_plus
                                , CS.impulse, CS.A, CS.b, CS.x, CS.linear_solver);

  // Copy back QDotPlus
  for (unsigned int i = 0; i < model.dof_count; i++) {
    QDotPlus[i] = CS.x[i];
  }

  // Copy back constraint impulses
  for (unsigned int i = 0; i < CS.size(); i++) {
    CS.impulse[i] = CS.x[model.dof_count + i];
  }

}